

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::filterAsContents(QPDFObjectHandle *this,TokenFilter *filter,Pipeline *next)

{
  element_type *peVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  Pl_QPDFTokenizer token_pipeline;
  long *local_80;
  long local_70;
  long lStack_68;
  undefined1 local_60 [56];
  QPDFObjGen local_28;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_28.obj = 0;
    local_28.gen = 0;
  }
  else {
    local_28 = peVar1->og;
  }
  QPDFObjGen::unparse_abi_cxx11_((string *)local_60,&local_28,' ');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x27be34);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
    local_80 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  Pl_QPDFTokenizer::Pl_QPDFTokenizer((Pl_QPDFTokenizer *)local_60,(char *)local_80,filter,next);
  pipeStreamData(this,(Pipeline *)local_60,0,qpdf_dl_specialized,false,false);
  Pl_QPDFTokenizer::~Pl_QPDFTokenizer((Pl_QPDFTokenizer *)local_60);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::filterAsContents(TokenFilter* filter, Pipeline* next)
{
    auto description = "token filter for object " + getObjGen().unparse(' ');
    Pl_QPDFTokenizer token_pipeline(description.c_str(), filter, next);
    this->pipeStreamData(&token_pipeline, 0, qpdf_dl_specialized);
}